

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  ssize_t bytes_read;
  wchar_t err2;
  archive_entry_header_gnutar *gnuheader;
  archive_entry_header_ustar *header;
  char *h;
  long lStack_38;
  wchar_t err;
  ssize_t bytes;
  size_t *unconsumed_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  bytes = (ssize_t)unconsumed;
  unconsumed_local = (size_t *)entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  while( true ) {
    tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
    pcVar3 = (char *)__archive_read_ahead((archive_read *)tar_local,0x200,&stack0xffffffffffffffc8);
    if (lStack_38 < 0) {
      return (wchar_t)lStack_38;
    }
    if (lStack_38 == 0) {
      return L'\x01';
    }
    if (lStack_38 < 0x200) {
      archive_set_error((archive *)tar_local,0x54,"Truncated tar archive");
      return L'\xffffffe2';
    }
    *(undefined8 *)bytes = 0x200;
    if ((*pcVar3 != '\0') || (wVar1 = archive_block_is_null(pcVar3), wVar1 == L'\0')) break;
    if ((tar_local->entry_pathname).s == (char *)0x0) {
      *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30000;
      (tar_local->entry_pathname).s = "tar";
    }
    if (*(int *)((long)&(entry_local->ae_hardlink).aes_mbs.length + 4) == 0) {
      tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
      pcVar3 = (char *)__archive_read_ahead((archive_read *)tar_local,0x200,(ssize_t *)0x0);
      if (((pcVar3 != (char *)0x0) && (*pcVar3 == '\0')) &&
         (wVar1 = archive_block_is_null(pcVar3), wVar1 != L'\0')) {
        __archive_read_consume((archive_read *)tar_local,0x200);
      }
      archive_clear_error((archive *)tar_local);
      return L'\x01';
    }
  }
  wVar1 = checksum((archive_read *)tar_local,pcVar3);
  if (wVar1 == L'\0') {
    tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
    archive_set_error((archive *)tar_local,0x16,"Damaged tar archive");
    return L'\xfffffff6';
  }
  iVar2 = *(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 4) + 1;
  *(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 4) = iVar2;
  if (iVar2 < 0x21) {
    switch(pcVar3[0x9c]) {
    case 'A':
      *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30002;
      (tar_local->entry_pathname).s = "Solaris tar";
      h._4_4_ = header_Solaris_ACL((archive_read *)tar_local,(tar *)entry_local,
                                   (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      break;
    default:
      if (*(long *)(pcVar3 + 0x101) == 0x20207261747375) {
        *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30004;
        (tar_local->entry_pathname).s = "GNU tar format";
        h._4_4_ = header_gnutar((archive_read *)tar_local,(tar *)entry_local,
                                (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      }
      else {
        iVar2 = memcmp(pcVar3 + 0x101,"ustar",5);
        if (iVar2 == 0) {
          if ((int)(tar_local->acl_text).buffer_length != 0x30002) {
            *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30001;
            (tar_local->entry_pathname).s = "POSIX ustar format";
          }
          h._4_4_ = header_ustar((archive_read *)tar_local,(tar *)entry_local,
                                 (archive_entry *)unconsumed_local,pcVar3);
        }
        else {
          *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30000;
          (tar_local->entry_pathname).s = "tar (non-POSIX)";
          h._4_4_ = header_old_tar((archive_read *)tar_local,(tar *)entry_local,
                                   (archive_entry *)unconsumed_local,pcVar3);
        }
      }
      break;
    case 'K':
      h._4_4_ = header_longlink((archive_read *)tar_local,(tar *)entry_local,
                                (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      break;
    case 'L':
      h._4_4_ = header_longname((archive_read *)tar_local,(tar *)entry_local,
                                (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      break;
    case 'V':
      h._4_4_ = header_volume((archive_read *)tar_local,(tar *)entry_local,
                              (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      break;
    case 'X':
      *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30002;
      (tar_local->entry_pathname).s = "POSIX pax interchange format (Sun variant)";
      h._4_4_ = header_pax_extensions
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      break;
    case 'g':
      *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30002;
      (tar_local->entry_pathname).s = "POSIX pax interchange format";
      h._4_4_ = header_pax_global((archive_read *)tar_local,(tar *)entry_local,
                                  (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
      if (h._4_4_ == L'\x01') {
        return L'\x01';
      }
      break;
    case 'x':
      *(undefined4 *)&(tar_local->acl_text).buffer_length = 0x30002;
      (tar_local->entry_pathname).s = "POSIX pax interchange format";
      h._4_4_ = header_pax_extensions
                          ((archive_read *)tar_local,(tar *)entry_local,
                           (archive_entry *)unconsumed_local,pcVar3,(size_t *)bytes);
    }
    if (h._4_4_ != L'\xffffffe2') {
      tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
      *(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 4) =
           *(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 4) + -1;
      if ((((h._4_4_ == L'\xffffffec') || (h._4_4_ == L'\0')) &&
          (*(int *)((long)&(entry_local->ae_fflags_text).aes_wcs.buffer_length + 4) == 0)) &&
         (((int)(entry_local->ae_hardlink).aes_mbs.length != 0 &&
          (wVar1 = read_mac_metadata_blob
                             ((archive_read *)tar_local,(tar *)entry_local,
                              (archive_entry *)unconsumed_local,(void *)0x0,(size_t *)bytes),
          wVar1 < h._4_4_)))) {
        h._4_4_ = wVar1;
      }
      if ((h._4_4_ != L'\xffffffec') && (h._4_4_ != L'\0')) {
        if (h._4_4_ == L'\x01') {
          archive_set_error((archive *)tar_local,0x16,"Damaged tar archive");
        }
        return L'\xffffffe2';
      }
      if ((char)(entry_local->ae_gname).aes_utf8.buffer_length != '\0') {
        if (((int)(entry_local->ae_gname).aes_utf8.length != 1) ||
           (*(int *)((long)&(entry_local->ae_gname).aes_utf8.length + 4) != 0)) {
          archive_set_error((archive *)tar_local,-1,"Unrecognized GNU sparse file format");
          return L'\xffffffec';
        }
        *(undefined1 *)&(entry_local->ae_gname).aes_utf8.buffer_length = 0;
        sVar4 = gnu_sparse_10_read((archive_read *)tar_local,(tar *)entry_local,(size_t *)bytes);
        if (sVar4 < 0) {
          return (wchar_t)sVar4;
        }
        (entry_local->ae_fflags_text).aes_mbs_in_locale.s =
             (entry_local->ae_fflags_text).aes_mbs_in_locale.s + -sVar4;
        *(undefined1 *)&(entry_local->ae_gname).aes_utf8.buffer_length = 0;
      }
      return h._4_4_;
    }
    return L'\xffffffe2';
  }
  tar_flush_unconsumed((archive_read *)tar_local,(size_t *)bytes);
  archive_set_error((archive *)tar_local,0x16,"Too many special headers");
  return L'\xffffffec';
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				if (bytes_read < 0)
					return ((int)bytes_read);
				tar->entry_bytes_remaining -= bytes_read;
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}